

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O3

void update_monster_region(monst *mon)

{
  ushort uVar1;
  region *reg;
  uint *puVar2;
  boolean bVar3;
  ulong uVar4;
  ulong uVar5;
  level *plVar6;
  long lVar7;
  
  plVar6 = mon->dlevel;
  if (plVar6->n_regions < 1) {
    return;
  }
  lVar7 = 0;
LAB_00233657:
  reg = plVar6->regions[lVar7];
  bVar3 = inside_region(reg,(int)mon->mx,(int)mon->my);
  uVar1 = reg->n_monst;
  uVar4 = (ulong)uVar1;
  if (bVar3 == '\0') {
    if (0 < (short)uVar1) {
      puVar2 = reg->monsters;
      uVar5 = 0;
      do {
        if (puVar2[uVar5] == mon->m_id) {
          uVar5 = 0;
          goto LAB_002336cb;
        }
        uVar5 = uVar5 + 1;
      } while (uVar4 != uVar5);
    }
  }
  else {
    if (0 < (short)uVar1) {
      uVar5 = 0;
      do {
        if (reg->monsters[uVar5] == mon->m_id) goto LAB_002336ea;
        uVar5 = uVar5 + 1;
      } while (uVar4 != uVar5);
    }
    add_mon_to_reg(reg,mon);
    plVar6 = mon->dlevel;
  }
  goto LAB_002336ea;
  while (uVar5 = uVar5 + 1, uVar4 != uVar5) {
LAB_002336cb:
    if (puVar2[uVar5] == mon->m_id) {
      reg->n_monst = uVar1 - 1;
      puVar2[uVar5] = puVar2[(long)(short)uVar1 + -1];
      break;
    }
  }
LAB_002336ea:
  lVar7 = lVar7 + 1;
  if (plVar6->n_regions <= lVar7) {
    return;
  }
  goto LAB_00233657;
}

Assistant:

void update_monster_region(struct monst *mon)
{
    int i;

    for (i = 0; i < mon->dlevel->n_regions; i++) {
	if (inside_region(mon->dlevel->regions[i], mon->mx, mon->my)) {
	    if (!mon_in_region(mon->dlevel->regions[i], mon))
		add_mon_to_reg(mon->dlevel->regions[i], mon);
	} else {
	    if (mon_in_region(mon->dlevel->regions[i], mon))
		remove_mon_from_reg(mon->dlevel->regions[i], mon);
	}
    }
}